

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
Lookup(PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator> *this,
      string_t *value)

{
  bool bVar1;
  hash_t hVar2;
  undefined8 in_RDX;
  primitive_dictionary_entry_t *this_00;
  ulong uVar3;
  string_t val;
  
  val.value.pointer.ptr = (char *)in_RDX;
  val.value._0_8_ = (value->value).pointer.ptr;
  hVar2 = Hash<duckdb::string_t>(*(duckdb **)&value->value,val);
  uVar3 = hVar2 & this->capacity_mask;
  if (this->dictionary[uVar3].index != 0xffffffff) {
    this_00 = this->dictionary + uVar3;
    do {
      bVar1 = string_t::operator==(&this_00->value,value);
      if (bVar1) break;
      uVar3 = uVar3 + 1 & this->capacity_mask;
      this_00 = this->dictionary + uVar3;
    } while (this_00->index != 0xffffffff);
  }
  return this->dictionary + uVar3;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}